

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorInit(VP8Encoder *enc,VP8EncIterator *it)

{
  VP8EncIterator *in_RSI;
  VP8Encoder *in_RDI;
  
  in_RSI->enc_ = in_RDI;
  in_RSI->yuv_in_ = (uint8_t *)((ulong)(in_RSI->yuv_mem_ + 0x1f) & 0xffffffffffffffe0);
  in_RSI->yuv_out_ = in_RSI->yuv_in_ + 0x200;
  in_RSI->yuv_out2_ = in_RSI->yuv_out_ + 0x200;
  in_RSI->yuv_p_ = in_RSI->yuv_out2_ + 0x200;
  in_RSI->lf_stats_ = in_RDI->lf_stats_;
  in_RSI->percent0_ = in_RDI->percent_;
  in_RSI->y_left_ = (uint8_t *)((ulong)(in_RSI->yuv_left_mem_ + 0x20) & 0xffffffffffffffe0);
  in_RSI->u_left_ = in_RSI->y_left_ + 0x20;
  in_RSI->v_left_ = in_RSI->u_left_ + 0x10;
  in_RSI->top_derr_ = in_RDI->top_derr_;
  VP8IteratorReset(in_RSI);
  return;
}

Assistant:

void VP8IteratorInit(VP8Encoder* const enc, VP8EncIterator* const it) {
  it->enc_ = enc;
  it->yuv_in_   = (uint8_t*)WEBP_ALIGN(it->yuv_mem_);
  it->yuv_out_  = it->yuv_in_ + YUV_SIZE_ENC;
  it->yuv_out2_ = it->yuv_out_ + YUV_SIZE_ENC;
  it->yuv_p_    = it->yuv_out2_ + YUV_SIZE_ENC;
  it->lf_stats_ = enc->lf_stats_;
  it->percent0_ = enc->percent_;
  it->y_left_ = (uint8_t*)WEBP_ALIGN(it->yuv_left_mem_ + 1);
  it->u_left_ = it->y_left_ + 16 + 16;
  it->v_left_ = it->u_left_ + 16;
  it->top_derr_ = enc->top_derr_;
  VP8IteratorReset(it);
}